

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

int __thiscall HFSubConsumer::handle_enqueue(HFSubConsumer *this,zframe_t *frame)

{
  code *pcVar1;
  bool bVar2;
  byte *pbVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  zframe_t *in_RSI;
  long in_RDI;
  zframe_t *tmp;
  consumer_token_t *in_stack_00000040;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_stack_00000048;
  producer_token_t *in_stack_ffffffffffffffb8;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_stack_ffffffffffffffc0;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *this_00;
  zframe_t *local_20;
  zframe_t *local_18 [3];
  
  pcVar1 = *(code **)(in_RDI + 200);
  local_18[0] = in_RSI;
  pbVar3 = zframe_data(in_RSI);
  sVar4 = zframe_size(local_18[0]);
  uVar5 = (*pcVar1)(pbVar3,sVar4,in_RDI);
  if ((uVar5 & 1) == 0) {
    zframe_destroy(local_18);
  }
  else {
    sVar6 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx
                      (in_stack_ffffffffffffffc0);
    if ((*(long *)(in_RDI + 0xb8) - 1U <= sVar6) &&
       (bVar2 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                          (in_stack_00000048,in_stack_00000040,(_zframe_t **)this), bVar2)) {
      zframe_destroy(&local_20);
    }
    moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::enqueue
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(_zframe_t **)0x1cccc4);
    if ((*(byte *)(in_RDI + 0x3b0) & 1) != 0) {
      this_00 = *(ConcurrentQueue<_zframe_t_*,_MyTraits> **)(in_RDI + 0x388);
      sVar6 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx(this_00);
      zsock_bsend(this_00,"8",sVar6,0);
      *(undefined1 *)(in_RDI + 0x3b0) = 0;
    }
  }
  return 0;
}

Assistant:

int HFSubConsumer::handle_enqueue(zframe_t *frame){
    //Only add to queue if it passes queuefilter
    if(!queuefilter(zframe_data(frame), zframe_size(frame), this)){
        zframe_destroy(&frame);
        return 0;
    }
    //Pseudo ring buffer, pops oldest so that ConcurrentQueue doesn't allocate new block and acts like concurrent ringbuffer
    if(framequeue.size_approx() >= buffersize-1){
        //Do this first before replacing with new frame
        zframe_t* tmp;
        if(framequeue.try_dequeue(replacetoken, tmp)){
            zframe_destroy(&tmp);
        }
    }
    framequeue.enqueue(ptoken, frame);

    if(waiting){
        zsock_bsend(rep, "8", static_cast<uint64_t>(framequeue.size_approx()), NULL);
        waiting = false;
    }
    return 0;
}